

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.cpp
# Opt level: O2

int diff(int argc,char **argv)

{
  vector<DiffLine,_std::allocator<DiffLine>_> diff_lines;
  string old_dir;
  string new_dir;
  vector<DiffLine,_std::allocator<DiffLine>_> local_118;
  vector<FileStatus,_std::allocator<FileStatus>_> local_100;
  vector<FileStatus,_std::allocator<FileStatus>_> status;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (1 < argc) {
    std::__cxx11::string::string((string *)&local_30,*argv,(allocator *)&old_dir);
    hashToDir(&new_dir,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::string((string *)&local_50,argv[1],(allocator *)&diff_lines);
    hashToDir(&old_dir,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (argc == 2) {
      std::__cxx11::string::string((string *)&local_70,(string *)&new_dir);
      std::__cxx11::string::string((string *)&local_90,(string *)&old_dir);
      diffStatus(&status,&local_70,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::vector<FileStatus,_std::allocator<FileStatus>_>::vector(&local_100,&status);
      strStatus_abi_cxx11_((string *)&diff_lines,&local_100);
      std::operator<<((ostream *)&std::cout,(string *)&diff_lines);
      std::__cxx11::string::~string((string *)&diff_lines);
      std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector(&local_100);
      std::vector<FileStatus,_std::allocator<FileStatus>_>::~vector(&status);
    }
    else {
      std::__cxx11::string::append((char *)&new_dir);
      std::__cxx11::string::append((char *)&new_dir);
      std::__cxx11::string::append((char *)&old_dir);
      std::__cxx11::string::append((char *)&old_dir);
      std::__cxx11::string::string((string *)&local_b0,(string *)&new_dir);
      std::__cxx11::string::string((string *)&local_d0,(string *)&old_dir);
      diff_files(&diff_lines,&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::vector<DiffLine,_std::allocator<DiffLine>_>::vector(&local_118,&diff_lines);
      printDiffLines(&local_118);
      std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector(&local_118);
      std::vector<DiffLine,_std::allocator<DiffLine>_>::~vector(&diff_lines);
    }
    std::__cxx11::string::~string((string *)&old_dir);
    std::__cxx11::string::~string((string *)&new_dir);
    return 0;
  }
  puts("diff need 2 or more arguments");
  exit(1);
}

Assistant:

int diff(int argc, char *argv[]){
    if(argc < 2){
        printf("diff need 2 or more arguments\n");
        exit(EXIT_FAILURE);
    }
    String new_dir = hashToDir(argv[0]);
    String old_dir = hashToDir(argv[1]);
    if (argc < 3){
        Vector<FileStatus> status = diffStatus(new_dir, old_dir);
        Cout << strStatus(status);
    } else{
        new_dir += "/";
        new_dir += argv[2];
        old_dir += "/";
        old_dir += argv[2];
        Vector<DiffLine> diff_lines = diff_files(new_dir,old_dir);
        printDiffLines(diff_lines);
    }
    return 0;
}